

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

void deqp::gls::Functional::anon_unknown_0::drawPrimitives
               (Functions *gl,deUint32 program,deUint32 type,
               vector<float,_std::allocator<float>_> *vertices,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *indices)

{
  glVertexAttribPointerFunc p_Var1;
  glDrawElementsFunc p_Var2;
  GLuint GVar3;
  deBool dVar4;
  TestError *this;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  deInt32 posLoc;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *indices_local;
  vector<float,_std::allocator<float>_> *vertices_local;
  deUint32 type_local;
  deUint32 program_local;
  Functions *gl_local;
  
  GVar3 = (*gl->getAttribLocation)(program,"a_position");
  while( true ) {
    dVar4 = ::deGetFalse();
    if ((dVar4 != 0) || ((int)GVar3 < 0)) break;
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      (*gl->useProgram)(program);
      (*gl->enableVertexAttribArray)(GVar3);
      p_Var1 = gl->vertexAttribPointer;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](vertices,0);
      (*p_Var1)(GVar3,4,0x1406,'\0',0,pvVar5);
      p_Var2 = gl->drawElements;
      sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(indices);
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](indices,0);
      (*p_Var2)(type,(GLsizei)sVar6,0x1403,pvVar7);
      (*gl->disableVertexAttribArray)(GVar3);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
             ,0x66);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void drawPrimitives (const glw::Functions& gl, deUint32 program, const deUint32 type, const vector<float>& vertices, const vector<deUint16>& indices)
{
	const deInt32 posLoc = gl.getAttribLocation(program, "a_position");

	TCU_CHECK(posLoc >= 0);

	gl.useProgram(program);
	gl.enableVertexAttribArray(posLoc);
	gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	gl.drawElements(type, GLsizei(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);

	gl.disableVertexAttribArray(posLoc);
}